

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall Session::setParameters(Session *this,void *inParam,size_t inParamLen)

{
  void *__dest;
  
  if (inParamLen != 0 && inParam != (void *)0x0) {
    if (this->param != (void *)0x0) {
      free(this->param);
      this->paramLen = 0;
    }
    __dest = malloc(inParamLen);
    this->param = __dest;
    if (__dest != (void *)0x0) {
      memcpy(__dest,inParam,inParamLen);
      this->paramLen = inParamLen;
    }
  }
  return;
}

Assistant:

void Session::setParameters(void* inParam, size_t inParamLen)
{
	if (inParam == NULL || inParamLen == 0) return;

	if (param != NULL)
	{
		free(param);
		paramLen = 0;
	}

	param = malloc(inParamLen);
	if (param != NULL)
	{
		memcpy(param, inParam, inParamLen);
		paramLen = inParamLen;
	}
}